

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

__m128i y_convolve_2tap_2x2_ssse3(uint8_t *src,ptrdiff_t stride,__m128i *coeffs,__m128i *s_16)

{
  undefined1 (*in_RCX) [16];
  __m128i *in_RDX;
  long in_RSI;
  long in_RDI;
  __m128i alVar1;
  __m128i ss;
  __m128i s_128 [2];
  __m128i local_f8;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_a8 [16];
  uint local_8c;
  undefined1 local_88 [16];
  uint local_6c;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_6c = (uint)*(short *)(in_RDI + in_RSI);
  local_88._4_4_ = 0;
  local_88._0_4_ = local_6c;
  *(undefined8 *)in_RCX[1] = local_88._0_8_;
  *(undefined8 *)(in_RCX[1] + 8) = 0;
  local_18 = *(undefined8 *)*in_RCX;
  uStack_10 = *(undefined8 *)(*in_RCX + 8);
  local_28 = *(undefined8 *)in_RCX[1];
  uStack_20 = *(undefined8 *)(in_RCX[1] + 8);
  local_e8 = vpunpcklwd_avx(*in_RCX,in_RCX[1]);
  local_8c = (uint)*(short *)(in_RDI + in_RSI * 2);
  local_a8._4_4_ = 0;
  local_a8._0_4_ = local_8c;
  *(undefined8 *)*in_RCX = local_a8._0_8_;
  *(undefined8 *)(*in_RCX + 8) = 0;
  local_48 = *(undefined8 *)*in_RCX;
  uStack_40 = *(undefined8 *)(*in_RCX + 8);
  local_38 = *(undefined8 *)in_RCX[1];
  uStack_30 = *(undefined8 *)(in_RCX[1] + 8);
  local_d8 = vpunpcklwd_avx(in_RCX[1],*in_RCX);
  local_58 = local_e8._0_8_;
  uStack_50 = local_e8._8_8_;
  local_68 = local_d8._0_8_;
  uStack_60 = local_d8._8_8_;
  local_f8 = (__m128i)vpunpcklbw_avx(local_e8,local_d8);
  local_a8 = ZEXT416(local_8c);
  local_88 = ZEXT416(local_6c);
  alVar1 = convolve_2tap_ssse3(&local_f8,in_RDX);
  alVar1[0] = alVar1[0];
  alVar1[1] = alVar1[1];
  return alVar1;
}

Assistant:

static inline __m128i y_convolve_2tap_2x2_ssse3(const uint8_t *const src,
                                                const ptrdiff_t stride,
                                                const __m128i coeffs[1],
                                                __m128i s_16[2]) {
  __m128i s_128[2];

  s_16[1] = _mm_cvtsi32_si128(*(int16_t *)(src + stride));
  s_128[0] = _mm_unpacklo_epi16(s_16[0], s_16[1]);
  s_16[0] = _mm_cvtsi32_si128(*(int16_t *)(src + 2 * stride));
  s_128[1] = _mm_unpacklo_epi16(s_16[1], s_16[0]);
  const __m128i ss = _mm_unpacklo_epi8(s_128[0], s_128[1]);
  return convolve_2tap_ssse3(&ss, coeffs);
}